

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O1

int loguru::init(EVP_PKEY_CTX *ctx)

{
  char cVar1;
  byte bVar2;
  Text TVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  Text ctx_00;
  ctype *pcVar7;
  Text *in_RDX;
  int iVar8;
  char *__s;
  long lVar9;
  EVP_PKEY_CTX *ctx_01;
  char *unaff_RBP;
  undefined8 *in_RSI;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  double __x;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x_00;
  Text str_right;
  Text fail_info;
  Text user_msg;
  int local_ec;
  Text user_msg_2;
  Text str_left;
  sigset_t local_c0;
  byte local_40;
  
  ctx_00._str = (char *)DAT_0016ad00;
  if ((long)*(int *)ctx < 1) {
    textprintf((char *)&str_left,"%d");
    textprintf((char *)&str_right,"%d",0);
    textprintf((char *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","argc",">","0",
               str_left._str,">",str_right._str);
    textprintf((char *)&user_msg,"Expected proper argc/argv");
    log_and_abort(0,fail_info._str,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                  ,0x215,"%s",user_msg._str);
  }
  if (in_RSI[*(int *)ctx] != 0) {
    textprintf((char *)&str_left,"N/A");
    textprintf((char *)&str_right,"N/A");
    textprintf((char *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","argv[argc]","==",
               "nullptr",str_left._str,"==",str_right._str);
    textprintf((char *)&user_msg,"Expected proper argc/argv");
    log_and_abort(0,fail_info._str,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                  ,0x216,"%s",user_msg._str);
  }
  pcVar5 = (char *)*in_RSI;
  pcVar6 = (char *)*in_RSI;
  do {
    do {
      __s = pcVar5;
      pcVar5 = pcVar6 + 1;
      cVar1 = *pcVar6;
      pcVar6 = pcVar5;
    } while (cVar1 == '/');
  } while ((cVar1 == '\\') || (pcVar5 = __s, cVar1 != '\0'));
  strlen(__s);
  std::__cxx11::string::_M_replace(0x16acf8,0,ctx_00._str,(ulong)__s);
  pcVar6 = getcwd(&s_current_dir,0x1000);
  if (pcVar6 == (char *)0x0) {
    errno_as_text();
    TVar3 = str_left;
    iVar4 = s_max_out_verbosity;
    if (s_max_out_verbosity < g_stderr_verbosity) {
      iVar4 = g_stderr_verbosity;
    }
    if (-2 < iVar4) {
      log(__x);
      ctx_00 = TVar3;
    }
    free(str_left._str);
  }
  pcVar6 = (char *)0x0;
  std::__cxx11::string::_M_replace(0x16ad18,0,DAT_0016ad20,0x150098);
  uVar12 = (ulong)*(uint *)ctx;
  if (0 < (int)*(uint *)ctx) {
    lVar9 = 0;
    unaff_RBP = (char *)&s_arguments_abi_cxx11_;
    do {
      pcVar6 = (char *)in_RSI[lVar9];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&str_left,pcVar6,(allocator<char> *)&str_right);
      uVar12 = local_c0.__val[0];
      TVar3 = str_left;
      if (local_c0.__val[0] != 0) {
        uVar10 = 0;
        do {
          bVar2 = TVar3._str[uVar10];
          uVar11 = (uint)bVar2;
          if (0x1f < bVar2) {
            if (bVar2 < 0x27) {
              if (uVar11 == 0x20) {
                pcVar6 = "\\ ";
              }
              else {
                if (uVar11 != 0x22) goto switchD_001381d3_default;
                pcVar6 = "\\\"";
              }
            }
            else if (uVar11 == 0x27) {
              pcVar6 = "\\\'";
            }
            else {
              if (uVar11 != 0x5c) goto switchD_001381d3_default;
              pcVar6 = "\\\\";
            }
            goto switchD_001381d3_caseD_7;
          }
          pcVar6 = "\\a";
          switch(bVar2) {
          case 7:
            break;
          case 8:
            pcVar6 = "\\b";
            break;
          case 9:
            pcVar6 = "\\t";
            break;
          case 10:
            pcVar6 = "\\n";
            break;
          case 0xb:
            pcVar6 = "\\v";
            break;
          case 0xc:
            pcVar6 = "\\f";
            break;
          case 0xd:
            pcVar6 = "\\r";
            break;
          default:
switchD_001381d3_default:
            if (bVar2 < 0x20) {
              pcVar6 = "\\x";
              std::__cxx11::string::append((char *)&s_arguments_abi_cxx11_);
              write_hex_digit((string *)(ulong)(bVar2 >> 4),(uint)pcVar6);
              write_hex_digit((string *)(ulong)(uVar11 & 0xf),(uint)pcVar6);
            }
            else {
              pcVar6 = (char *)(ulong)(uint)(int)(char)bVar2;
              std::__cxx11::string::push_back('\x18');
            }
            goto LAB_0013824e;
          }
switchD_001381d3_caseD_7:
          std::__cxx11::string::append((char *)&s_arguments_abi_cxx11_);
LAB_0013824e:
          uVar10 = uVar10 + 1;
          ctx_00 = TVar3;
        } while (uVar12 != uVar10);
      }
      if ((ulong *)str_left._str != local_c0.__val + 1) {
        pcVar6 = (char *)(local_c0.__val[1] + 1);
        operator_delete(str_left._str,(ulong)pcVar6);
      }
      lVar9 = lVar9 + 1;
      if (lVar9 < *(int *)ctx) {
        pcVar6 = " ";
        std::__cxx11::string::append((char *)&s_arguments_abi_cxx11_);
      }
      uVar12 = (ulong)*(int *)ctx;
    } while (lVar9 < (long)uVar12);
  }
  iVar4 = (int)uVar12;
  if (in_RDX != (Text *)0x0) {
    if (1 < iVar4) {
      local_ec = 1;
      ctx_01 = (EVP_PKEY_CTX *)0x1;
      do {
        iVar8 = (int)ctx_01;
        unaff_RBP = (char *)in_RSI[iVar8];
        ctx_00._str = (char *)strlen((char *)in_RDX);
        pcVar6 = (char *)in_RDX;
        iVar4 = strncmp(unaff_RBP,(char *)in_RDX,(size_t)ctx_00._str);
        if (iVar4 == 0) {
          bVar2 = unaff_RBP[(long)ctx_00._str];
          pcVar6 = "";
          std::locale::locale((locale *)&str_right,"");
          pcVar7 = std::use_facet<std::ctype<char>>((locale *)&str_right);
          bVar13 = (*(byte *)(*(long *)(pcVar7 + 0x30) + 1 + (ulong)bVar2 * 2) & 4) == 0;
          std::locale::~locale((locale *)&str_right);
        }
        else {
          bVar13 = false;
        }
        if (bVar13) {
          if (unaff_RBP[(long)ctx_00._str] == '\0') {
            uVar11 = iVar8 + 1;
            ctx_01 = (EVP_PKEY_CTX *)(ulong)uVar11;
            unaff_RBP = (char *)(ulong)*(uint *)ctx;
            if ((int)*(uint *)ctx <= (int)uVar11) goto LAB_0013866c;
            unaff_RBP = (char *)in_RSI[(int)uVar11];
            uVar11 = (int)uVar12 - 2;
          }
          else {
            uVar11 = (int)uVar12 - 1;
            unaff_RBP = unaff_RBP + (long)ctx_00._str;
          }
          uVar12 = (ulong)uVar11;
          iVar8 = (int)ctx_01;
          ctx_00._str = unaff_RBP + (*unaff_RBP == '=');
          iVar4 = get_verbosity_from_name(ctx_00._str);
          if (iVar4 == -10) {
            str_left._str = (char *)0x0;
            pcVar6 = (char *)&str_left;
            lVar9 = strtol(ctx_00._str,(char **)pcVar6,10);
            g_stderr_verbosity = (int)lVar9;
            if ((str_left._str == (char *)0x0) ||
               (iVar4 = g_stderr_verbosity, *str_left._str != '\0')) goto LAB_00138664;
          }
        }
        else {
          lVar9 = (long)local_ec;
          local_ec = local_ec + 1;
          in_RSI[lVar9] = in_RSI[iVar8];
          iVar4 = g_stderr_verbosity;
        }
        g_stderr_verbosity = iVar4;
        iVar4 = (int)uVar12;
        ctx_01 = (EVP_PKEY_CTX *)(ulong)(iVar8 + 1U);
      } while ((int)(iVar8 + 1U) < *(int *)ctx);
    }
    *(int *)ctx = iVar4;
    in_RSI[iVar4] = 0;
  }
  set_thread_name("main thread");
  __x_00 = extraout_XMM0_Qa;
  if (-1 < g_stderr_verbosity) {
    if (g_preamble == '\x01') {
      print_preamble_header((char *)&str_left,(size_t)pcVar6);
      if ((g_colorlogtostderr == '\x01') && (s_terminal_has_color == '\x01')) {
        fprintf(_stderr,"%s%s%s\n","\x1b[0m","\x1b[2m",&str_left);
      }
      else {
        fprintf(_stderr,"%s\n",&str_left);
      }
    }
    fflush(_stderr);
    __x_00 = extraout_XMM0_Qa_00;
  }
  iVar4 = s_max_out_verbosity;
  if (s_max_out_verbosity < g_stderr_verbosity) {
    iVar4 = g_stderr_verbosity;
  }
  if (g_internal_verbosity <= iVar4) {
    __x_00 = log(__x_00);
  }
  if (s_current_dir != '\0') {
    iVar4 = s_max_out_verbosity;
    if (s_max_out_verbosity < g_stderr_verbosity) {
      iVar4 = g_stderr_verbosity;
    }
    if (g_internal_verbosity <= iVar4) {
      __x_00 = log(__x_00);
    }
  }
  iVar4 = s_max_out_verbosity;
  if (s_max_out_verbosity < g_stderr_verbosity) {
    iVar4 = g_stderr_verbosity;
  }
  if (g_internal_verbosity <= iVar4) {
    __x_00 = log(__x_00);
  }
  iVar4 = s_max_out_verbosity;
  if (s_max_out_verbosity < g_stderr_verbosity) {
    iVar4 = g_stderr_verbosity;
  }
  if (g_internal_verbosity <= iVar4) {
    log(__x_00);
  }
  ctx_01 = (EVP_PKEY_CTX *)0x0;
  memset((sigaction *)&str_left,0,0x98);
  sigemptyset(&local_c0);
  local_40 = local_40 | 4;
  str_left._str = (char *)signal_handler;
  while (iVar4 = sigaction(*(int *)(ctx_01 + 0x1699b0),(sigaction *)&str_left,(sigaction *)0x0),
        iVar4 != -1) {
    ctx_01 = ctx_01 + 0x10;
    if (ctx_01 == (EVP_PKEY_CTX *)0x70) {
      iVar4 = atexit(on_atexit);
      return iVar4;
    }
  }
  init(ctx_01);
LAB_00138664:
  init((EVP_PKEY_CTX *)ctx_00._str);
LAB_0013866c:
  textprintf((char *)&str_left,"%d",(ulong)ctx_01 & 0xffffffff);
  textprintf((char *)&fail_info,"%d",(ulong)unaff_RBP & 0xffffffff);
  textprintf((char *)&user_msg,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","arg_it","<","argc",
             str_left._str,"<",fail_info._str);
  textprintf((char *)&user_msg_2,"Missing verbosiy level after %s",in_RDX);
  log_and_abort(0,user_msg._str,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                ,0x1ab,"%s",user_msg_2._str);
}

Assistant:

void init(int& argc, char* argv[], const char* verbosity_flag)
	{
		CHECK_GT_F(argc,       0,       "Expected proper argc/argv");
		CHECK_EQ_F(argv[argc], nullptr, "Expected proper argc/argv");

		s_argv0_filename = filename(argv[0]);

		#ifdef _WIN32
			#define getcwd _getcwd
		#endif

		if (!getcwd(s_current_dir, sizeof(s_current_dir)))
		{
			const auto error_text = errno_as_text();
			LOG_F(WARNING, "Failed to get current working directory: %s", error_text.c_str());
		}

		s_arguments = "";
		for (int i = 0; i < argc; ++i) {
			escape(s_arguments, argv[i]);
			if (i + 1 < argc) {
				s_arguments += " ";
			}
		}

		if (verbosity_flag) {
			parse_args(argc, argv, verbosity_flag);
		}

		#if LOGURU_PTLS_NAMES || LOGURU_WINTHREADS
			set_thread_name("main thread");
		#elif LOGURU_PTHREADS
			char old_thread_name[16] = {0};
			auto this_thread = pthread_self();
			#if defined(__APPLE__) || defined(__linux__)
				pthread_getname_np(this_thread, old_thread_name, sizeof(old_thread_name));
			#endif
			if (old_thread_name[0] == 0) {
				#ifdef __APPLE__
					pthread_setname_np("main thread");
				#elif defined(__FreeBSD__) || defined(__OpenBSD__)
					pthread_set_name_np(this_thread, "main thread");
				#elif defined(__linux__)
					pthread_setname_np(this_thread, "main thread");
				#endif
			}
		#endif // LOGURU_PTHREADS

		if (g_stderr_verbosity >= Verbosity_INFO) {
			if (g_preamble) {
				char preamble_explain[LOGURU_PREAMBLE_WIDTH];
				print_preamble_header(preamble_explain, sizeof(preamble_explain));
				if (g_colorlogtostderr && s_terminal_has_color) {
					fprintf(stderr, "%s%s%s\n", terminal_reset(), terminal_dim(), preamble_explain);
				} else {
					fprintf(stderr, "%s\n", preamble_explain);
				}
			}
			fflush(stderr);
		}
		VLOG_F(g_internal_verbosity, "arguments: %s", s_arguments.c_str());
		if (strlen(s_current_dir) != 0)
		{
			VLOG_F(g_internal_verbosity, "Current dir: %s", s_current_dir);
		}
		VLOG_F(g_internal_verbosity, "stderr verbosity: %d", g_stderr_verbosity);
		VLOG_F(g_internal_verbosity, "-----------------------------------");

		install_signal_handlers();

		atexit(on_atexit);
	}